

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O3

void __thiscall cdnsBlockParameterOld::cdnsBlockParameterOld(cdnsBlockParameterOld *this)

{
  (this->server_addresses).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->server_addresses).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->interfaces).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->server_addresses).super__Vector_base<cbor_bytes,_std::allocator<cbor_bytes>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interfaces).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->interfaces).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->snaplen = 0;
  this->promisc = 0;
  this->query_timeout = 0;
  this->skew_timeout = 0;
  cbor_text::cbor_text(&this->filter);
  this->max_block_qr_items = 0;
  this->collect_malformed = 0;
  (this->ignore_rr_types).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ignore_rr_types).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->accept_rr_types).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ignore_rr_types).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accept_rr_types).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accept_rr_types).super__Vector_base<cbor_text,_std::allocator<cbor_text>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->query_options = 0;
  this->response_options = 0;
  return;
}

Assistant:

cdnsBlockParameterOld::cdnsBlockParameterOld():
    query_timeout(0),
    skew_timeout(0),
    snaplen(0),
    promisc(0),
    query_options(0),
    response_options(0),
    max_block_qr_items(0),
    collect_malformed(0)
{
}